

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O1

filepos_t UpdateDataSizeTrackEntry
                    (matroska_trackentry *Element,bool_t bWithDefault,bool_t bForceWithoutMandatory,
                    int ForProfile)

{
  ebml_context *peVar1;
  ebml_master *peVar2;
  ebml_master *Element_00;
  ebml_integer *Element_01;
  ulong uVar3;
  ebml_integer *Element_02;
  int64_t iVar4;
  ebml_binary *Element_03;
  err_t eVar5;
  uint8_t *__ptr;
  void *pvVar6;
  filepos_t fVar7;
  MatroskaTrackEncodingCompAlgo MVar8;
  size_t CompressedSize;
  size_t CompressedSize_1;
  size_t Offset;
  uint8_t *local_60;
  array local_58;
  bool_t local_40;
  size_t local_38;
  
  local_40 = bWithDefault;
  peVar1 = MATROSKA_getContextContentEncodings();
  Element_01 = (ebml_integer *)0x0;
  peVar2 = (ebml_master *)EBML_MasterFindFirstElt(&Element->Base,peVar1,0,0,0);
  MVar8 = MATROSKA_TRACK_ENCODING_COMP_NONE;
  if (peVar2 != (ebml_master *)0x0) {
    peVar1 = MATROSKA_getContextContentEncoding();
    peVar2 = (ebml_master *)EBML_MasterFindFirstElt(peVar2,peVar1,0,0,0);
    if (peVar2 != (ebml_master *)0x0) {
      peVar1 = MATROSKA_getContextContentCompression();
      Element_00 = (ebml_master *)EBML_MasterFindFirstElt(peVar2,peVar1,0,0,0);
      if (Element_00 != (ebml_master *)0x0) {
        peVar1 = MATROSKA_getContextContentEncodingScope();
        Element_01 = (ebml_integer *)EBML_MasterFindFirstElt(peVar2,peVar1,0,0,0);
        if (Element_01 != (ebml_integer *)0x0) {
          uVar3 = EBML_IntegerValue(Element_01);
          if ((uVar3 & 2) != 0) {
            peVar1 = MATROSKA_getContextContentCompAlgo();
            Element_02 = (ebml_integer *)EBML_MasterFindFirstElt(Element_00,peVar1,1,1,ForProfile);
            iVar4 = EBML_IntegerValue(Element_02);
            MVar8 = (MatroskaTrackEncodingCompAlgo)iVar4;
          }
          goto LAB_0010b54b;
        }
      }
    }
    Element_01 = (ebml_integer *)0x0;
  }
LAB_0010b54b:
  if (MVar8 != Element->CodecPrivateCompressionAlgo) {
    peVar1 = MATROSKA_getContextCodecPrivate();
    Element_03 = (ebml_binary *)EBML_MasterFindFirstElt(&Element->Base,peVar1,0,0,0);
    if (Element->CodecPrivateCompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_NONE) {
      if (Element_03 != (ebml_binary *)0x0) {
        local_58._Begin = (char *)(Element_03->Data)._Used;
        __ptr = (uint8_t *)malloc((size_t)local_58._Begin);
        local_60 = __ptr;
        if (((MVar8 == MATROSKA_TRACK_ENCODING_COMP_ZLIB) &&
            (eVar5 = CompressFrameZLib((uint8_t *)(Element_03->Data)._Begin,
                                       (Element_03->Base).DataSize,&local_60,(size_t *)&local_58),
            eVar5 == 0)) &&
           (eVar5 = EBML_BinarySetData(Element_03,local_60,(size_t)local_58._Begin), eVar5 == 0)) {
          Element->CodecPrivateCompressionAlgo = MATROSKA_TRACK_ENCODING_COMP_ZLIB;
        }
        free(__ptr);
      }
      if (Element->CodecPrivateCompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_NONE) {
        uVar3 = EBML_IntegerValue(Element_01);
        EBML_IntegerSetValue(Element_01,uVar3 ^ 2);
      }
    }
    else if (Element_03 == (ebml_binary *)0x0) {
      Element->CodecPrivateCompressionAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
    }
    else {
      local_60 = (uint8_t *)(Element_03->Data)._Used;
      local_38 = 0;
      local_58._Begin = (char *)0x0;
      local_58._Used = 0;
      if (((Element->CodecPrivateCompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB) &&
          (eVar5 = UnCompressFrameZLib((uint8_t *)(Element_03->Data)._Begin,
                                       (Element_03->Base).DataSize,&local_58,(size_t *)&local_60,
                                       &local_38), eVar5 == 0)) &&
         (eVar5 = EBML_BinarySetData(Element_03,(uint8_t *)local_58._Begin,(size_t)local_60),
         eVar5 == 0)) {
        Element->CodecPrivateCompressionAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
      }
      ArrayClear(&local_58);
    }
  }
  pvVar6 = Node_InheritedVMT((node *)Element,0x45544b4d);
  fVar7 = (**(code **)((long)pvVar6 + 0x98))(Element,local_40,bForceWithoutMandatory,ForProfile);
  return fVar7;
}

Assistant:

static filepos_t UpdateDataSizeTrackEntry(matroska_trackentry *Element, bool_t bWithDefault, bool_t bForceWithoutMandatory, int ForProfile)
{
    MatroskaTrackEncodingCompAlgo CompressionAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
    ebml_integer *Scope = NULL;
    ebml_element *Encodings = EBML_MasterFindChild(Element,MATROSKA_getContextContentEncodings());
    if (Encodings)
    {
        ebml_element *Elt2 = EBML_MasterFindChild((ebml_master*)Encodings,MATROSKA_getContextContentEncoding());
        if (Elt2)
        {
            ebml_element *Elt =  EBML_MasterFindChild((ebml_master*)Elt2,MATROSKA_getContextContentCompression());
            if (Elt)
            {
                Scope = (ebml_integer*)EBML_MasterFindChild((ebml_master*)Elt2,MATROSKA_getContextContentEncodingScope());
                if (Scope && (EBML_IntegerValue(Scope) & MATROSKA_CONTENTENCODINGSCOPE_PRIVATE)!=0)
                {
                    ebml_element *Header = EBML_MasterGetChild((ebml_master*)Elt, MATROSKA_getContextContentCompAlgo(),ForProfile);
                    CompressionAlgo = EBML_IntegerValue((ebml_integer*)Header);
                }
            }
        }
    }

    if (CompressionAlgo != Element->CodecPrivateCompressionAlgo)
    {
        ebml_binary *CodecPrivate = (ebml_binary*)EBML_MasterFindChild(Element,MATROSKA_getContextCodecPrivate());
        if (Element->CodecPrivateCompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_NONE)
        {
            // compress the codec private
            if (CodecPrivate)
            {
                size_t CompressedSize = ARRAYCOUNT(CodecPrivate->Data,uint8_t);
                uint8_t *Compressed = malloc(CompressedSize);
                uint8_t *NewCompressed = Compressed;
#if defined(CONFIG_ZLIB)
                if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB &&
                    CompressFrameZLib(ARRAYBEGIN(CodecPrivate->Data,uint8_t), (size_t)CodecPrivate->Base.DataSize, &NewCompressed, &CompressedSize)==ERR_NONE)
                {
                    if (EBML_BinarySetData(CodecPrivate, NewCompressed, CompressedSize)==ERR_NONE)
                        Element->CodecPrivateCompressionAlgo = MATROSKA_TRACK_ENCODING_COMP_ZLIB;
                }
#endif
                free(Compressed);
            }
            if (Element->CodecPrivateCompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_NONE)
                EBML_IntegerSetValue(Scope, EBML_IntegerValue(Scope) ^ MATROSKA_CONTENTENCODINGSCOPE_PRIVATE);
        }
        else
        {
            if (CodecPrivate)
            {
                size_t CompressedSize = ARRAYCOUNT(CodecPrivate->Data,uint8_t);
                size_t Offset = 0;
                array Compressed;

                ArrayInit(&Compressed);
#if defined(CONFIG_ZLIB)
                if (Element->CodecPrivateCompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB &&
                    UnCompressFrameZLib(ARRAYBEGIN(CodecPrivate->Data,uint8_t), (size_t)CodecPrivate->Base.DataSize, &Compressed, &CompressedSize, &Offset)==ERR_NONE)
                {
                    if (EBML_BinarySetData(CodecPrivate, ARRAYBEGIN(Compressed,uint8_t), CompressedSize)==ERR_NONE)
                        Element->CodecPrivateCompressionAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
                }
#endif
                ArrayClear(&Compressed);
            }
            else
                Element->CodecPrivateCompressionAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
            if (Element->CodecPrivateCompressionAlgo != MATROSKA_TRACK_ENCODING_COMP_NONE)
            {
                // TODO: add in the Compression header that the header is still compressed
            }
        }
    }
    return INHERITED(Element,ebml_element_vmt,MATROSKA_TRACKENTRY_CLASS)->UpdateDataSize(Element, bWithDefault, bForceWithoutMandatory, ForProfile);
}